

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O2

void __thiscall
pstore::index::
hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::iterator_base<true>::increment_internal_node(iterator_base<true> *this)

{
  parent_stack *this_00;
  index_pointer node_00;
  index_pointer node_01;
  uint uVar1;
  uint uVar2;
  reference pvVar3;
  ulong uVar4;
  index_pointer *piVar5;
  int line;
  char *str;
  ulong uVar6;
  linear_node *linear;
  internal_node *internal;
  shared_ptr<const_void> node;
  internal_node *local_80;
  internal_node *local_78;
  index_pointer local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68 [2];
  undefined8 local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_50 [2];
  internal_node **local_40;
  undefined8 *local_38;
  
  this_00 = &this->visited_parents_;
  array_stack<pstore::index::details::parent_type,_13UL>::pop(this_00);
  if ((this->visited_parents_).elements_ != 0) {
    local_78 = (internal_node *)0x0;
    local_58 = 0;
    a_Stack_50[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_80 = (internal_node *)0x0;
    pvVar3 = array_stack<pstore::index::details::parent_type,_13UL>::top(this_00);
    node_00.addr_.a_ = *(address *)&pvVar3->node;
    uVar6 = pvVar3->position;
    uVar1 = get_shift_bits(this);
    if (uVar1 < 0x42) {
      details::internal_node::get_node
                ((pair<std::shared_ptr<const_pstore::index::details::internal_node>,_const_pstore::index::details::internal_node_*>
                  *)&local_70.addr_,this->db_,node_00);
      local_40 = &local_78;
      local_38 = &local_58;
      std::tuple<std::shared_ptr<void_const>&,pstore::index::details::internal_node_const*&>::
      operator=((tuple<std::shared_ptr<void_const>&,pstore::index::details::internal_node_const*&> *
                )&local_40,
                (pair<std::shared_ptr<const_pstore::index::details::internal_node>,_const_pstore::index::details::internal_node_*>
                 *)&local_70.addr_);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_68);
      if (local_78 == (internal_node *)0x0) {
        line = 0x234;
        str = "internal != nullptr";
        goto LAB_0010d34b;
      }
      uVar2 = details::internal_node::size(local_78);
      uVar4 = (ulong)uVar2;
    }
    else {
      details::linear_node::get_node
                ((pair<std::shared_ptr<const_pstore::index::details::linear_node>,_const_pstore::index::details::linear_node_*>
                  *)&local_70.addr_,this->db_,node_00);
      local_40 = &local_80;
      local_38 = &local_58;
      std::tuple<std::shared_ptr<void_const>&,pstore::index::details::linear_node_const*&>::
      operator=((tuple<std::shared_ptr<void_const>&,pstore::index::details::linear_node_const*&> *)
                &local_40,
                (pair<std::shared_ptr<const_pstore::index::details::linear_node>,_const_pstore::index::details::linear_node_*>
                 *)&local_70.addr_);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_68);
      if (local_80 == (internal_node *)0x0) {
        line = 0x238;
        str = "linear != nullptr";
        goto LAB_0010d34b;
      }
      uVar4 = local_80->bitmap_;
    }
    line = 0x23c;
    str = "!parent.node.is_leaf () && parent.position < size";
    if ((((ulong)node_00.internal_ & 1) == 0) || (uVar4 <= uVar6)) {
LAB_0010d34b:
      assert_failed(str,
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map.hpp"
                    ,line);
    }
    uVar6 = uVar6 + 1;
    if (uVar6 < uVar4) {
      pvVar3 = array_stack<pstore::index::details::parent_type,_13UL>::top(this_00);
      pvVar3->position = uVar6;
      if (uVar1 < 0x42) {
        piVar5 = details::internal_node::operator[](local_78,uVar6);
        node_01 = *piVar5;
        if (((ulong)node_01.internal_ & 1) == 0) {
          local_68[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xffffffffffffffff;
          local_70 = node_01;
          array_stack<pstore::index::details::parent_type,_13UL>::push
                    (this_00,(value_type *)&local_70.addr_);
        }
        else {
          move_to_left_most_child(this,node_01);
        }
      }
      else {
        local_70.internal_ = (internal_node *)details::linear_node::operator[](local_80,uVar6);
        local_68[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xffffffffffffffff;
        array_stack<pstore::index::details::parent_type,_13UL>::push
                  (this_00,(value_type *)&local_70.addr_);
      }
    }
    else {
      increment_internal_node(this);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_50);
  }
  return;
}

Assistant:

void hamt_map<KeyType, ValueType, Hash,
                      KeyEqual>::iterator_base<IsConstIterator>::increment_internal_node () {

            visited_parents_.pop ();

            if (!visited_parents_.empty ()) {
                std::shared_ptr<void const> node;
                internal_node const * internal = nullptr;
                linear_node const * linear = nullptr;

                details::parent_type parent = visited_parents_.top ();
                unsigned const shifts = this->get_shift_bits ();
                bool const is_internal_node = details::depth_is_internal_node (shifts);
                std::size_t size = 0;
                if (is_internal_node) {
                    std::tie (node, internal) = internal_node::get_node (db_, parent.node);
                    PSTORE_ASSERT (internal != nullptr);
                    size = internal->size ();
                } else {
                    std::tie (node, linear) = linear_node::get_node (db_, parent.node);
                    PSTORE_ASSERT (linear != nullptr);
                    size = linear->size ();
                }

                PSTORE_ASSERT (!parent.node.is_leaf () && parent.position < size);
                ++parent.position;

                if (parent.position >= size) {
                    this->increment_internal_node ();
                } else {
                    // Update the parent.
                    visited_parents_.top ().position = parent.position;

                    // Visit the child.
                    if (is_internal_node) {
                        index_pointer child = (*internal)[parent.position];
                        if (child.is_internal ()) {
                            this->move_to_left_most_child (child);
                        } else {
                            visited_parents_.push (details::parent_type{child});
                        }
                    } else {
                        visited_parents_.push (
                            details::parent_type{index_pointer{(*linear)[parent.position]}});
                    }
                }
            }
        }